

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_iterator.h
# Opt level: O0

TreeDFIterator<const_spvtools::opt::SENode> * __thiscall
spvtools::opt::TreeDFIterator<const_spvtools::opt::SENode>::operator++
          (TreeDFIterator<const_spvtools::opt::SENode> *this)

{
  TreeDFIterator<const_spvtools::opt::SENode> *this_local;
  
  MoveToNextNode(this);
  return this;
}

Assistant:

TreeDFIterator& operator++() {
    MoveToNextNode();
    return *this;
  }